

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fstack.cpp
# Opt level: O1

void fstk_RunFor(char *symName,int32_t start,int32_t stop,int32_t step,int32_t reptLineNo,char *body
                ,size_t size)

{
  Context *pCVar1;
  bool bVar2;
  Symbol *pSVar3;
  long lVar4;
  char *pcVar5;
  int *piVar6;
  ulong uVar7;
  uint32_t uVar8;
  
  pSVar3 = sym_AddVar(symName,start);
  if (pSVar3->type != SYM_VAR) {
    return;
  }
  if (start < stop && 0 < step) {
    lVar4 = (long)~start + (long)stop;
    uVar7 = (ulong)(uint)step;
  }
  else {
    if (start <= stop || -1 < step) {
      uVar8 = 0;
      if (step == 0) {
        uVar8 = 0;
        error("FOR cannot have a step value of 0\n");
      }
      goto LAB_0010c424;
    }
    lVar4 = (long)~stop + (long)start;
    uVar7 = -(long)step;
  }
  uVar8 = (int)(lVar4 / (long)uVar7) + 1;
LAB_0010c424:
  if ((stop < start && 0 < step) || (start < stop && step < 0)) {
    warning(WARNING_BACKWARDS_FOR,"FOR goes backwards from %d to %d by %d\n",start,(ulong)(uint)stop
            ,(ulong)(uint)step);
  }
  if ((uVar8 != 0) && (bVar2 = newReptContext(reptLineNo,body,size), pCVar1 = contextStack, bVar2))
  {
    contextStack->nbReptIters = uVar8;
    pCVar1->forValue = start;
    pCVar1->forStep = step;
    pcVar5 = strdup(symName);
    pCVar1->forName = pcVar5;
    if (pcVar5 == (char *)0x0) {
      piVar6 = __errno_location();
      pcVar5 = strerror(*piVar6);
      fatalerror("Not enough memory for FOR symbol name: %s\n",pcVar5);
    }
  }
  return;
}

Assistant:

void fstk_RunFor(char const *symName, int32_t start, int32_t stop, int32_t step,
		     int32_t reptLineNo, char *body, size_t size)
{
	struct Symbol *sym = sym_AddVar(symName, start);

	if (sym->type != SYM_VAR)
		return;

	uint32_t count = 0;

	if (step > 0 && start < stop)
		count = ((int64_t)stop - start - 1) / step + 1;
	else if (step < 0 && stop < start)
		count = ((int64_t)start - stop - 1) / -(int64_t)step + 1;
	else if (step == 0)
		error("FOR cannot have a step value of 0\n");

	if ((step > 0 && start > stop) || (step < 0 && start < stop))
		warning(WARNING_BACKWARDS_FOR, "FOR goes backwards from %d to %d by %d\n",
			start, stop, step);

	if (count == 0)
		return;
	if (!newReptContext(reptLineNo, body, size))
		return;

	contextStack->nbReptIters = count;
	contextStack->forValue = start;
	contextStack->forStep = step;
	contextStack->forName = strdup(symName);
	if (!contextStack->forName)
		fatalerror("Not enough memory for FOR symbol name: %s\n", strerror(errno));
}